

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getSource
          (Replacer *this,MemoryCopy *curr,Index sizeIdx,Index sourceIdx)

{
  uintptr_t uVar1;
  Block *pBVar2;
  Expression *pEVar3;
  Expression *rightOperand;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_70;
  undefined4 *local_68;
  undefined1 local_60 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> exprs;
  allocator_type local_31;
  
  pBVar2 = (Block *)addOffsetGlobal(this,curr->source,(Name)(curr->sourceMemory).super_IString.str);
  if (this->parent->checkBounds == true) {
    exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&this->builder;
    uVar1 = (this->parent->pointerType).id;
    pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    pEVar3->_id = LocalGetId;
    pEVar3[1]._id = sourceIdx;
    (pEVar3->type).id = uVar1;
    uVar1 = (this->parent->pointerType).id;
    rightOperand = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    rightOperand->_id = LocalGetId;
    rightOperand[1]._id = sizeIdx;
    (rightOperand->type).id = uVar1;
    pEVar3 = makeAddGtuMemoryTrap
                       (this,pEVar3,rightOperand,(Name)(curr->sourceMemory).super_IString.str);
    uVar1 = (this->parent->pointerType).id;
    local_68 = (undefined4 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    *local_68 = 8;
    local_68[4] = sourceIdx;
    *(uintptr_t *)(local_68 + 2) = uVar1;
    __l._M_len = 2;
    __l._M_array = &local_70;
    local_70 = pEVar3;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60,__l,
               &local_31);
    pBVar2 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       ((Builder *)
                        exprs.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_60)
    ;
    if (local_60 != (undefined1  [8])0x0) {
      operator_delete((void *)local_60,
                      (long)exprs.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_60);
    }
  }
  return (Expression *)pBVar2;
}

Assistant:

Expression* getSource(MemoryCopy* curr,
                          Index sizeIdx = Index(-1),
                          Index sourceIdx = Index(-1)) {
      Expression* sourceValue =
        addOffsetGlobal(curr->source, curr->sourceMemory);

      if (parent.checkBounds) {
        Expression* boundsCheck = makeAddGtuMemoryTrap(
          builder.makeLocalGet(sourceIdx, parent.pointerType),
          builder.makeLocalGet(sizeIdx, parent.pointerType),
          curr->sourceMemory);
        Expression* sourceGet =
          builder.makeLocalGet(sourceIdx, parent.pointerType);
        std::vector<Expression*> exprs = {boundsCheck, sourceGet};
        return builder.makeBlock(exprs);
      }

      return sourceValue;
    }